

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_variance_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1b73cb8::ObmcVarianceTest_DISABLED_Speed_Test::TestBody
          (ObmcVarianceTest_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  uint8_t uVar1;
  byte bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  int64_t iVar5;
  ulong uVar6;
  int i;
  int iVar7;
  long lVar8;
  bool bVar9;
  uint tst_sse;
  uint ref_sse;
  aom_usec_timer test_timer;
  aom_usec_timer ref_timer;
  uint8_t pre [16384];
  int32_t mask [16384];
  int32_t wsrc [16384];
  uint uStack_240a8;
  uint uStack_240a4;
  aom_usec_timer aStack_240a0;
  aom_usec_timer aStack_24080;
  uchar auStack_24060 [16384];
  uint32_t auStack_20060 [16384];
  int aiStack_10060 [16396];
  
  this_00 = &(this->super_ObmcVarianceTest).
             super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
             .rng_;
  uVar3 = testing::internal::Random::Generate(&this_00->random_,0x81);
  for (lVar8 = 0; lVar8 != 0x4000; lVar8 = lVar8 + 1) {
    uVar1 = libaom_test::ACMRandom::Rand8(this_00);
    auStack_24060[lVar8] = uVar1;
    bVar2 = libaom_test::ACMRandom::Rand8(this_00);
    uVar4 = testing::internal::Random::Generate(&this_00->random_,0x1001);
    aiStack_10060[lVar8] = uVar4 * bVar2;
    uVar4 = testing::internal::Random::Generate(&this_00->random_,0x1001);
    auStack_20060[lVar8] = uVar4;
  }
  ::aom_usec_timer_start(&aStack_24080);
  iVar7 = 1000000;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    (*(this->super_ObmcVarianceTest).
      super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
      .params_.ref_func)(auStack_24060,uVar3,aiStack_10060,(int *)auStack_20060,&uStack_240a4);
  }
  ::aom_usec_timer_mark(&aStack_24080);
  iVar5 = ::aom_usec_timer_elapsed(&aStack_24080);
  ::aom_usec_timer_start(&aStack_240a0);
  iVar7 = 1000000;
  while (bVar9 = iVar7 != 0, iVar7 = iVar7 + -1, bVar9) {
    (*(this->super_ObmcVarianceTest).
      super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*,_unsigned_int_*)>
      .params_.tst_func)(auStack_24060,uVar3,aiStack_10060,(int *)auStack_20060,&uStack_240a8);
  }
  ::aom_usec_timer_mark(&aStack_240a0);
  uVar6 = ::aom_usec_timer_elapsed(&aStack_240a0);
  printf("c_time=%d \t simd_time=%d \t gain=%f \n",(double)(int)iVar5 / (double)(int)uVar6,iVar5,
         uVar6 & 0xffffffff);
  return;
}

Assistant:

TEST_P(ObmcVarianceTest, DISABLED_Speed) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  const int pre_stride = this->rng_(MAX_SB_SIZE + 1);

  for (int i = 0; i < MAX_SB_SQUARE; ++i) {
    pre[i] = this->rng_.Rand8();
    wsrc[i] = this->rng_.Rand8() * this->rng_(kMaskMax * kMaskMax + 1);
    mask[i] = this->rng_(kMaskMax * kMaskMax + 1);
  }

  const int num_loops = 1000000;
  unsigned int ref_sse, tst_sse;
  aom_usec_timer ref_timer, test_timer;

  aom_usec_timer_start(&ref_timer);
  for (int i = 0; i < num_loops; ++i) {
    params_.ref_func(pre, pre_stride, wsrc, mask, &ref_sse);
  }
  aom_usec_timer_mark(&ref_timer);
  const int elapsed_time_c =
      static_cast<int>(aom_usec_timer_elapsed(&ref_timer));

  aom_usec_timer_start(&test_timer);
  for (int i = 0; i < num_loops; ++i) {
    params_.tst_func(pre, pre_stride, wsrc, mask, &tst_sse);
  }
  aom_usec_timer_mark(&test_timer);
  const int elapsed_time_simd =
      static_cast<int>(aom_usec_timer_elapsed(&test_timer));

  printf("c_time=%d \t simd_time=%d \t gain=%f \n", elapsed_time_c,
         elapsed_time_simd,
         static_cast<double>(elapsed_time_c) / elapsed_time_simd);
}